

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi-type-conversions.cpp
# Opt level: O2

int main(void)

{
  environment env;
  environment local_c;
  
  diy::mpi::environment::environment(&local_c);
  TestConversions<ompi_communicator_t_*,_diy::mpi::communicator>::Run
            ((ompi_communicator_t *)&ompi_mpi_comm_world);
  diy::mpi::environment::~environment(&local_c);
  return 0;
}

Assistant:

int main()
{
  diy::mpi::environment env;

  TestConversions<MPI_Comm, diy::mpi::communicator>::Run(MPI_COMM_WORLD);
  TestConversions<MPI_Datatype, diy::mpi::datatype>::Run();
  TestConversions<MPI_Op, diy::mpi::operation>::Run();
  TestConversions<MPI_Status, diy::mpi::status>::Run();

  // This test is expected to pass or fail during compilation
  return 0;
}